

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetEntityIDList
          (Aggregate_State_PDU *this,
          vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
          *EI)

{
  KUINT16 *pKVar1;
  KUINT16 KVar2;
  KUINT16 KVar3;
  KUINT16 KVar4;
  ushort uVar5;
  
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + this->m_ui16NumEntities * -6;
  std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
  ::operator=(&this->m_vEI,EI);
  KVar4 = (KUINT16)((uint)(*(int *)&(this->m_vEI).
                                    super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->m_vEI).
                                   super__Vector_base<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
  this->m_ui16NumEntities = KVar4;
  KVar2 = (this->super_Header).super_Header6.m_ui16PDULength;
  KVar3 = this->m_ui16NumberOfPaddingOctets;
  uVar5 = (this->m_ui16NumAggregates + KVar4) * 2 & 2;
  this->m_ui16NumberOfPaddingOctets = uVar5;
  (this->super_Header).super_Header6.m_ui16PDULength = uVar5 + ((KVar4 * 6 + KVar2) - KVar3);
  return;
}

Assistant:

void Aggregate_State_PDU::SetEntityIDList( const vector<EntityIdentifier> & EI )
{
    // Reset the PDU length field
    m_ui16PDULength -= m_ui16NumEntities * EntityIdentifier::ENTITY_IDENTIFER_SIZE;

    m_vEI = EI;
    m_ui16NumEntities = m_vEI.size();
    m_ui16PDULength += m_ui16NumEntities * EntityIdentifier::ENTITY_IDENTIFER_SIZE;
    updatePadding();
}